

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

Gia_Man_t * Of_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Gia_Man_t *p_00;
  int iVar1;
  Of_Man_t *p_01;
  Gia_Obj_t *pObj;
  bool bVar2;
  float fVar3;
  Gia_Man_t *local_50;
  int local_40;
  int Time;
  int Id;
  int i;
  Of_Man_t *p;
  Gia_Man_t *pCls;
  Gia_Man_t *pNew;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManHasChoices(pGia);
  if (iVar1 != 0) {
    pPars->fCoarsen = 0;
    pPars->fCutMin = 1;
  }
  local_50 = pGia;
  if (pPars->fCoarsen != 0) {
    local_50 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
  }
  p_01 = Of_StoCreate(local_50,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    printf("\n");
    printf("Derived ");
    Gia_ManPrintMuxStats(local_50);
    printf("\n");
  }
  Of_ManPrintInit(p_01);
  Of_ManComputeCuts(p_01);
  Of_ManPrintQuit(p_01);
  Time = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_01->pGia->vCis);
    bVar2 = false;
    if (Time < iVar1) {
      p_00 = p_01->pGia;
      pObj = Gia_ManCi(p_01->pGia,Time);
      local_40 = Gia_ObjId(p_00,pObj);
      bVar2 = local_40 != 0;
    }
    if (!bVar2) break;
    if (p_01->pGia->vInArrs == (Vec_Flt_t *)0x0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = Vec_FltEntry(p_01->pGia->vInArrs,Time);
      fVar3 = Abc_MaxFloat(0.0,fVar3);
    }
    iVar1 = Of_Flt2Int(fVar3);
    Of_ObjSetDelay1(p_01,local_40,iVar1);
    Of_ObjSetDelay2(p_01,local_40,iVar1);
    Time = Time + 1;
  }
  if (p_01->pPars->nFastEdges == 0) {
    p_01->Iter = 0;
    while (p_01->Iter < p_01->pPars->nRounds) {
      if (p_01->Iter == 0) {
        Of_ManComputeForward1(p_01);
        Of_ManComputeBackward1(p_01);
        Of_ManPrintStats(p_01,"Delay");
      }
      else {
        Of_ManComputeForward1(p_01);
        Of_ManComputeBackward1(p_01);
        Of_ManPrintStats(p_01,"Flow ");
      }
      p_01->Iter = p_01->Iter + 1;
    }
    while (p_01->Iter < p_01->pPars->nRounds + p_01->pPars->nRoundsEla) {
      if (p_01->Iter < p_01->pPars->nRounds + p_01->pPars->nRoundsEla + -1) {
        Of_ManComputeForward2(p_01);
        Of_ManComputeBackward3(p_01);
        Of_ManPrintStats(p_01,"Area ");
      }
      else {
        Of_ManComputeForward1(p_01);
        Of_ManComputeBackward3(p_01);
        Of_ManPrintStats(p_01,"Area ");
      }
      p_01->Iter = p_01->Iter + 1;
    }
  }
  else {
    p_01->pPars->nRounds = 1;
    p_01->Iter = 0;
    while (p_01->Iter < p_01->pPars->nRounds) {
      if (p_01->Iter == 0) {
        Of_ManComputeForwardDircon1(p_01);
        Of_ManComputeBackwardDircon1(p_01);
        Of_ManPrintStats(p_01,"Delay");
      }
      else {
        Of_ManComputeForwardDircon1(p_01);
        Of_ManComputeBackwardDircon1(p_01);
        Of_ManPrintStats(p_01,"Flow ");
      }
      p_01->Iter = p_01->Iter + 1;
    }
  }
  pGia_local = Of_ManDeriveMapping(p_01);
  Gia_ManMappingVerify(pGia_local);
  if (pGia_local->vPacking != (Vec_Int_t *)0x0) {
    Gia_ManConvertPackingToEdges(pGia_local);
  }
  Of_StoDelete(p_01);
  if (local_50 != pGia) {
    Gia_ManStop(local_50);
  }
  if (pGia_local == (Gia_Man_t *)0x0) {
    pGia_local = Gia_ManDup(pGia);
  }
  return pGia_local;
}

Assistant:

Gia_Man_t * Of_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Of_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0, pPars->fCutMin = 1; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Of_StoCreate( pCls, pPars );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Of_ManPrintInit( p );
    Of_ManComputeCuts( p );
    Of_ManPrintQuit( p );

    Gia_ManForEachCiId( p->pGia, Id, i )
    {
        int Time = Of_Flt2Int(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0);
        Of_ObjSetDelay1( p, Id, Time );
        Of_ObjSetDelay2( p, Id, Time );
    }

    if ( p->pPars->nFastEdges )
    {
        p->pPars->nRounds = 1;
        for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        {
            if ( p->Iter == 0 )
            {
                Of_ManComputeForwardDircon1( p );
                Of_ManComputeBackwardDircon1( p );
                Of_ManPrintStats( p, "Delay" );
            }
            else 
            {
                Of_ManComputeForwardDircon1( p );
                Of_ManComputeBackwardDircon1( p );
                Of_ManPrintStats( p, "Flow " );
            }
        }
    }
    else
    {
        for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        {
            if ( p->Iter == 0 )
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward1( p );
                Of_ManPrintStats( p, "Delay" );
            }
            else 
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward1( p );
                Of_ManPrintStats( p, "Flow " );
            }
        }
        for ( ; p->Iter < p->pPars->nRounds + p->pPars->nRoundsEla; p->Iter++ )
        {
            if ( p->Iter < p->pPars->nRounds + p->pPars->nRoundsEla - 1 )
            {
                Of_ManComputeForward2( p );
                Of_ManComputeBackward3( p );
                Of_ManPrintStats( p, "Area " );
            }
            else
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward3( p );
                Of_ManPrintStats( p, "Area " );
            }
        }
    }

    pNew = Of_ManDeriveMapping( p );
    Gia_ManMappingVerify( pNew );
    if ( pNew->vPacking )
        Gia_ManConvertPackingToEdges( pNew );
    //Of_ManPrintCuts( p );
    Of_StoDelete( p );
    if ( pCls != pGia )
        Gia_ManStop( pCls );
    if ( pNew == NULL )
        return Gia_ManDup( pGia );
    return pNew;
}